

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ModportPortSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ModportPortSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::ArgumentDirection&>
          (BumpAllocator *this,basic_string_view<char,_std::char_traits<char>_> *args,
          SourceLocation *args_1,ArgumentDirection *args_2)

{
  ArgumentDirection AVar1;
  string_view name;
  ModportPortSymbol *this_00;
  
  this_00 = (ModportPortSymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ModportPortSymbol *)this->endPtr < this_00 + 1) {
    this_00 = (ModportPortSymbol *)allocateSlow(this,0x170,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  name._M_len = args->_M_len;
  name._M_str = args->_M_str;
  AVar1 = *args_2;
  ast::ValueSymbol::ValueSymbol
            (&this_00->super_ValueSymbol,ModportPort,name,*args_1,
             (bitmask<slang::ast::DeclaredTypeFlags>)0x0);
  this_00->direction = AVar1;
  this_00->internalSymbol = (Symbol *)0x0;
  this_00->explicitConnection = (Expression *)0x0;
  this_00->connExpr = (Expression *)0x0;
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }